

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitiveIntegers.c
# Opt level: O3

void sysbvm_primitiveInteger_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t selector;
  sysbvm_tuple_t sVar2;
  code *pcVar3;
  code *pcVar4;
  code *entryPoint;
  bool bVar5;
  
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"c8",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"asChar8",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asInteger",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"negated",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_negated);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"bitInvert",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_bitInvert);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"highBit",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_highBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"lowBit",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_lowBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"+",2,0x1c,(void *)0x0,sysbvm_char8_primitive_add);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"-",2,0x1c,(void *)0x0,
             sysbvm_char8_primitive_subtract);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"*",2,0x1c,(void *)0x0,
             sysbvm_char8_primitive_multiply);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"/",2,0x1c,(void *)0x0,sysbvm_char8_primitive_divide
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"//",2,0x1c,(void *)0x0,
             sysbvm_char8_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"%",2,0x1c,(void *)0x0,
             sysbvm_char8_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"\\\\",2,0x1c,(void *)0x0,
             sysbvm_char8_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"&",2,0x1c,(void *)0x0,sysbvm_char8_primitive_bitAnd
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"|",2,0x1c,(void *)0x0,sysbvm_char8_primitive_bitOr)
  ;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"^",2,0x1c,(void *)0x0,sysbvm_char8_primitive_bitXor
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"<<",2,0x1c,(void *)0x0,
             sysbvm_char8_primitive_shiftLeft);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,">>",2,0x1c,(void *)0x0,
             sysbvm_char8_primitive_shiftRight);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"=",2,0x1c,(void *)0x0,sysbvm_char8_primitive_equals
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"~=",2,0x1c,(void *)0x0,
             sysbvm_char8_primitive_notEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"<",2,0x1c,(void *)0x0,
             sysbvm_char8_primitive_lessThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"<=",2,0x1c,(void *)0x0,
             sysbvm_char8_primitive_lessEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,">",2,0x1c,(void *)0x0,
             sysbvm_char8_primitive_greaterThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,">=",2,0x1c,(void *)0x0,
             sysbvm_char8_primitive_greaterEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asBoolean",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asBoolean);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asBoolean16",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asBoolean16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asBoolean32",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asBoolean32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asBoolean64",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asBoolean64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asUInt8",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asUInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asInt8",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asChar8",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asChar8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asUInt16",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asUInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asInt16",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asChar16",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asChar16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asUInt32",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asUInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asInt32",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asChar32",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asChar32);
  pcVar4 = sysbvm_char8_primitive_asUInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asUInt64",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asUInt64);
  pcVar3 = sysbvm_char8_primitive_asInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asInt64",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asInt64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asFloat32",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asFloat32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asFloat64",1,0x1c,(void *)0x0,
             sysbvm_char8_primitive_asFloat64);
  if ((context->roots).sizeType == (context->roots).uint32Type) {
    pcVar4 = sysbvm_char8_primitive_asUInt32;
    pcVar3 = sysbvm_char8_primitive_asInt32;
  }
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asUIntPointer",1,0x1c,(void *)0x0,pcVar4);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asIntPointer",1,0x1c,(void *)0x0,pcVar3);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char8Type,"asSize",1,0x1c,(void *)0x0,pcVar4);
  sVar2 = (context->roots).uint8Type;
  sVar1 = sysbvm_function_createPrimitive
                    (context,1,0x1c,(void *)0x0,sysbvm_uint8_primitive_printString);
  sysbvm_type_setPrintStringFunction(context,sVar2,sVar1);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"u8",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"asUInt8",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asInteger",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"negated",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_negated);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"bitInvert",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_bitInvert);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"highBit",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_highBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"lowBit",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_lowBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"+",2,0x1c,(void *)0x0,sysbvm_uint8_primitive_add);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"-",2,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_subtract);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"*",2,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_multiply);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"/",2,0x1c,(void *)0x0,sysbvm_uint8_primitive_divide
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"//",2,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"%",2,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"\\\\",2,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"&",2,0x1c,(void *)0x0,sysbvm_uint8_primitive_bitAnd
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"|",2,0x1c,(void *)0x0,sysbvm_uint8_primitive_bitOr)
  ;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"^",2,0x1c,(void *)0x0,sysbvm_uint8_primitive_bitXor
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"<<",2,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_shiftLeft);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,">>",2,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_shiftRight);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"=",2,0x1c,(void *)0x0,sysbvm_uint8_primitive_equals
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"~=",2,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_notEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"<",2,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_lessThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"<=",2,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_lessEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,">",2,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_greaterThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,">=",2,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_greaterEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asBoolean",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asBoolean);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asBoolean16",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asBoolean16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asBoolean32",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asBoolean32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asBoolean64",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asBoolean64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asUInt8",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asUInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asInt8",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asChar8",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asChar8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asUInt16",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asUInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asInt16",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asChar16",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asChar16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asUInt32",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asUInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asInt32",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asChar32",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asChar32);
  pcVar4 = sysbvm_uint8_primitive_asUInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asUInt64",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asUInt64);
  pcVar3 = sysbvm_uint8_primitive_asInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asInt64",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asInt64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asFloat32",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asFloat32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asFloat64",1,0x1c,(void *)0x0,
             sysbvm_uint8_primitive_asFloat64);
  if ((context->roots).sizeType == (context->roots).uint32Type) {
    pcVar4 = sysbvm_uint8_primitive_asUInt32;
    pcVar3 = sysbvm_uint8_primitive_asInt32;
  }
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asUIntPointer",1,0x1c,(void *)0x0,pcVar4);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asIntPointer",1,0x1c,(void *)0x0,pcVar3);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint8Type,"asSize",1,0x1c,(void *)0x0,pcVar4);
  sVar2 = (context->roots).int8Type;
  sVar1 = sysbvm_function_createPrimitive
                    (context,1,0x1c,(void *)0x0,sysbvm_int8_primitive_printString);
  sysbvm_type_setPrintStringFunction(context,sVar2,sVar1);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"i8",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"asInt8",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asInteger",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"negated",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_negated);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"bitInvert",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_bitInvert);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"highBit",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_highBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"lowBit",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_lowBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"+",2,0x1c,(void *)0x0,sysbvm_int8_primitive_add);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"-",2,0x1c,(void *)0x0,sysbvm_int8_primitive_subtract
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"*",2,0x1c,(void *)0x0,sysbvm_int8_primitive_multiply
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"/",2,0x1c,(void *)0x0,sysbvm_int8_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"//",2,0x1c,(void *)0x0,sysbvm_int8_primitive_divide)
  ;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"%",2,0x1c,(void *)0x0,
             sysbvm_int8_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"\\\\",2,0x1c,(void *)0x0,
             sysbvm_int8_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"&",2,0x1c,(void *)0x0,sysbvm_int8_primitive_bitAnd);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"|",2,0x1c,(void *)0x0,sysbvm_int8_primitive_bitOr);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"^",2,0x1c,(void *)0x0,sysbvm_int8_primitive_bitXor);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"<<",2,0x1c,(void *)0x0,
             sysbvm_int8_primitive_shiftLeft);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,">>",2,0x1c,(void *)0x0,
             sysbvm_int8_primitive_shiftRight);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"=",2,0x1c,(void *)0x0,sysbvm_int8_primitive_equals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"~=",2,0x1c,(void *)0x0,
             sysbvm_int8_primitive_notEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"<",2,0x1c,(void *)0x0,sysbvm_int8_primitive_lessThan
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"<=",2,0x1c,(void *)0x0,
             sysbvm_int8_primitive_lessEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,">",2,0x1c,(void *)0x0,
             sysbvm_int8_primitive_greaterThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,">=",2,0x1c,(void *)0x0,
             sysbvm_int8_primitive_greaterEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asBoolean",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asBoolean);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asBoolean16",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asBoolean16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asBoolean32",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asBoolean32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asBoolean64",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asBoolean64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asUInt8",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asUInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asInt8",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asChar8",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asChar8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asUInt16",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asUInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asInt16",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asChar16",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asChar16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asUInt32",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asUInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asInt32",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asChar32",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asChar32);
  pcVar4 = sysbvm_int8_primitive_asUInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asUInt64",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asUInt64);
  pcVar3 = sysbvm_int8_primitive_asInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asInt64",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asInt64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asFloat32",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asFloat32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asFloat64",1,0x1c,(void *)0x0,
             sysbvm_int8_primitive_asFloat64);
  if ((context->roots).sizeType == (context->roots).uint32Type) {
    pcVar4 = sysbvm_int8_primitive_asUInt32;
    pcVar3 = sysbvm_int8_primitive_asInt32;
  }
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asUIntPointer",1,0x1c,(void *)0x0,pcVar4);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asIntPointer",1,0x1c,(void *)0x0,pcVar3);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int8Type,"asSize",1,0x1c,(void *)0x0,pcVar4);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"c16",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"asChar16",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asInteger",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"negated",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_negated);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"bitInvert",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_bitInvert);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"highBit",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_highBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"lowBit",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_lowBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"+",2,0x1c,(void *)0x0,sysbvm_char16_primitive_add)
  ;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"-",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_subtract);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"*",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_multiply);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"/",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"//",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"%",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"\\\\",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"&",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_bitAnd);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"|",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_bitOr);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"^",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_bitXor);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"<<",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_shiftLeft);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,">>",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_shiftRight);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"=",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_equals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"~=",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_notEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"<",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_lessThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"<=",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_lessEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,">",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_greaterThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,">=",2,0x1c,(void *)0x0,
             sysbvm_char16_primitive_greaterEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asBoolean",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asBoolean);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asBoolean16",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asBoolean16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asBoolean32",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asBoolean32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asBoolean64",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asBoolean64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asUInt8",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asUInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asInt8",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asChar8",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asChar8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asUInt16",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asUInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asInt16",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asChar16",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asChar16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asUInt32",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asUInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asInt32",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asChar32",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asChar32);
  pcVar4 = sysbvm_char16_primitive_asUInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asUInt64",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asUInt64);
  pcVar3 = sysbvm_char16_primitive_asInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asInt64",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asInt64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asFloat32",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asFloat32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asFloat64",1,0x1c,(void *)0x0,
             sysbvm_char16_primitive_asFloat64);
  if ((context->roots).sizeType == (context->roots).uint32Type) {
    pcVar4 = sysbvm_char16_primitive_asUInt32;
    pcVar3 = sysbvm_char16_primitive_asInt32;
  }
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asUIntPointer",1,0x1c,(void *)0x0,pcVar4);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asIntPointer",1,0x1c,(void *)0x0,pcVar3);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char16Type,"asSize",1,0x1c,(void *)0x0,pcVar4);
  sVar2 = (context->roots).uint16Type;
  sVar1 = sysbvm_function_createPrimitive
                    (context,1,0x1c,(void *)0x0,sysbvm_uint16_primitive_printString);
  sysbvm_type_setPrintStringFunction(context,sVar2,sVar1);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"u16",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"asUInt16",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asInteger",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"negated",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_negated);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"bitInvert",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_bitInvert);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"highBit",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_highBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"lowBit",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_lowBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"+",2,0x1c,(void *)0x0,sysbvm_uint16_primitive_add)
  ;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"-",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_subtract);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"*",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_multiply);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"/",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"//",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"%",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"\\\\",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"&",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_bitAnd);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"|",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_bitOr);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"^",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_bitXor);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"<<",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_shiftLeft);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,">>",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_shiftRight);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"=",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_equals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"~=",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_notEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"<",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_lessThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"<=",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_lessEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,">",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_greaterThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,">=",2,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_greaterEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asBoolean",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asBoolean);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asBoolean16",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asBoolean16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asBoolean32",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asBoolean32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asBoolean64",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asBoolean64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asUInt8",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asUInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asInt8",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asChar8",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asChar8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asUInt16",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asUInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asInt16",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asChar16",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asChar16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asUInt32",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asUInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asInt32",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asChar32",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asChar32);
  pcVar4 = sysbvm_uint16_primitive_asUInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asUInt64",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asUInt64);
  pcVar3 = sysbvm_uint16_primitive_asInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asInt64",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asInt64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asFloat32",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asFloat32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asFloat64",1,0x1c,(void *)0x0,
             sysbvm_uint16_primitive_asFloat64);
  if ((context->roots).sizeType == (context->roots).uint32Type) {
    pcVar4 = sysbvm_uint16_primitive_asUInt32;
    pcVar3 = sysbvm_uint16_primitive_asInt32;
  }
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asUIntPointer",1,0x1c,(void *)0x0,pcVar4);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asIntPointer",1,0x1c,(void *)0x0,pcVar3);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint16Type,"asSize",1,0x1c,(void *)0x0,pcVar4);
  sVar2 = (context->roots).int16Type;
  sVar1 = sysbvm_function_createPrimitive
                    (context,1,0x1c,(void *)0x0,sysbvm_int16_primitive_printString);
  sysbvm_type_setPrintStringFunction(context,sVar2,sVar1);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"i16",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"asInt16",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asInteger",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"negated",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_negated);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"bitInvert",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_bitInvert);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"highBit",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_highBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"lowBit",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_lowBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"+",2,0x1c,(void *)0x0,sysbvm_int16_primitive_add);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"-",2,0x1c,(void *)0x0,
             sysbvm_int16_primitive_subtract);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"*",2,0x1c,(void *)0x0,
             sysbvm_int16_primitive_multiply);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"/",2,0x1c,(void *)0x0,sysbvm_int16_primitive_divide
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"//",2,0x1c,(void *)0x0,
             sysbvm_int16_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"%",2,0x1c,(void *)0x0,
             sysbvm_int16_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"\\\\",2,0x1c,(void *)0x0,
             sysbvm_int16_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"&",2,0x1c,(void *)0x0,sysbvm_int16_primitive_bitAnd
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"|",2,0x1c,(void *)0x0,sysbvm_int16_primitive_bitOr)
  ;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"^",2,0x1c,(void *)0x0,sysbvm_int16_primitive_bitXor
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"<<",2,0x1c,(void *)0x0,
             sysbvm_int16_primitive_shiftLeft);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,">>",2,0x1c,(void *)0x0,
             sysbvm_int16_primitive_shiftRight);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"=",2,0x1c,(void *)0x0,sysbvm_int16_primitive_equals
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"~=",2,0x1c,(void *)0x0,
             sysbvm_int16_primitive_notEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"<",2,0x1c,(void *)0x0,
             sysbvm_int16_primitive_lessThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"<=",2,0x1c,(void *)0x0,
             sysbvm_int16_primitive_lessEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,">",2,0x1c,(void *)0x0,
             sysbvm_int16_primitive_greaterThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,">=",2,0x1c,(void *)0x0,
             sysbvm_int16_primitive_greaterEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asBoolean",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asBoolean);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asBoolean16",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asBoolean16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asBoolean32",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asBoolean32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asBoolean64",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asBoolean64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asUInt8",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asUInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asInt8",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asChar8",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asChar8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asUInt16",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asUInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asInt16",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asChar16",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asChar16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asUInt32",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asUInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asInt32",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asChar32",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asChar32);
  pcVar4 = sysbvm_int16_primitive_asUInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asUInt64",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asUInt64);
  pcVar3 = sysbvm_int16_primitive_asInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asInt64",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asInt64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asFloat32",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asFloat32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asFloat64",1,0x1c,(void *)0x0,
             sysbvm_int16_primitive_asFloat64);
  if ((context->roots).sizeType == (context->roots).uint32Type) {
    pcVar4 = sysbvm_int16_primitive_asUInt32;
    pcVar3 = sysbvm_int16_primitive_asInt32;
  }
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asUIntPointer",1,0x1c,(void *)0x0,pcVar4);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asIntPointer",1,0x1c,(void *)0x0,pcVar3);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int16Type,"asSize",1,0x1c,(void *)0x0,pcVar4);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"c32",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"asChar32",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asInteger",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"negated",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_negated);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"bitInvert",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_bitInvert);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"highBit",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_highBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"lowBit",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_lowBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"+",2,0x1c,(void *)0x0,sysbvm_char32_primitive_add)
  ;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"-",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_subtract);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"*",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_multiply);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"/",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"//",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"%",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"\\\\",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"&",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_bitAnd);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"|",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_bitOr);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"^",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_bitXor);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"<<",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_shiftLeft);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,">>",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_shiftRight);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"=",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_equals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"~=",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_notEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"<",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_lessThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"<=",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_lessEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,">",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_greaterThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,">=",2,0x1c,(void *)0x0,
             sysbvm_char32_primitive_greaterEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asBoolean",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asBoolean);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asBoolean16",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asBoolean16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asBoolean32",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asBoolean32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asBoolean64",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asBoolean64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asUInt8",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asUInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asInt8",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asChar8",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asChar8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asUInt16",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asUInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asInt16",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asChar16",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asChar16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asUInt32",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asUInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asInt32",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asChar32",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asChar32);
  pcVar4 = sysbvm_char32_primitive_asUInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asUInt64",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asUInt64);
  pcVar3 = sysbvm_char32_primitive_asInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asInt64",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asInt64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asFloat32",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asFloat32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asFloat64",1,0x1c,(void *)0x0,
             sysbvm_char32_primitive_asFloat64);
  if ((context->roots).sizeType == (context->roots).uint32Type) {
    pcVar4 = sysbvm_char32_primitive_asUInt32;
    pcVar3 = sysbvm_char32_primitive_asInt32;
  }
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asUIntPointer",1,0x1c,(void *)0x0,pcVar4);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asIntPointer",1,0x1c,(void *)0x0,pcVar3);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).char32Type,"asSize",1,0x1c,(void *)0x0,pcVar4);
  sVar2 = (context->roots).uint32Type;
  sVar1 = sysbvm_function_createPrimitive
                    (context,1,0x1c,(void *)0x0,sysbvm_uint32_primitive_printString);
  sysbvm_type_setPrintStringFunction(context,sVar2,sVar1);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"u32",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"asUInt32",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asInteger",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"negated",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_negated);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"bitInvert",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_bitInvert);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"highBit",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_highBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"lowBit",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_lowBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"+",2,0x1c,(void *)0x0,sysbvm_uint32_primitive_add)
  ;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"-",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_subtract);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"*",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_multiply);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"/",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"//",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"%",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"\\\\",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"&",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_bitAnd);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"|",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_bitOr);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"^",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_bitXor);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"<<",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_shiftLeft);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,">>",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_shiftRight);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"=",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_equals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"~=",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_notEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"<",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_lessThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"<=",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_lessEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,">",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_greaterThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,">=",2,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_greaterEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asBoolean",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asBoolean);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asBoolean16",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asBoolean16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asBoolean32",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asBoolean32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asBoolean64",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asBoolean64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asUInt8",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asUInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asInt8",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asChar8",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asChar8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asUInt16",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asUInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asInt16",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asChar16",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asChar16);
  pcVar3 = sysbvm_uint32_primitive_asUInt32;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asUInt32",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asUInt32);
  pcVar4 = sysbvm_uint32_primitive_asInt32;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asInt32",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asChar32",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asChar32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asUInt64",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asUInt64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asInt64",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asInt64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asFloat32",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asFloat32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asFloat64",1,0x1c,(void *)0x0,
             sysbvm_uint32_primitive_asFloat64);
  sVar2 = (context->roots).uint32Type;
  sVar1 = (context->roots).sizeType;
  if (sVar1 == sVar2) {
    sysbvm_context_setIntrinsicPrimitiveMethod
              (context,sVar1,"asUIntPointer",1,0x1c,(void *)0x0,sysbvm_uint32_primitive_asUInt32);
  }
  else {
    sysbvm_context_setIntrinsicPrimitiveMethod
              (context,sVar2,"asUIntPointer",1,0x1c,(void *)0x0,sysbvm_uint32_primitive_asUInt64);
    pcVar4 = sysbvm_uint32_primitive_asInt64;
    pcVar3 = sysbvm_uint32_primitive_asUInt64;
  }
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asIntPointer",1,0x1c,(void *)0x0,pcVar4);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint32Type,"asSize",1,0x1c,(void *)0x0,pcVar3);
  sVar2 = (context->roots).int32Type;
  sVar1 = sysbvm_function_createPrimitive
                    (context,1,0x1c,(void *)0x0,sysbvm_int32_primitive_printString);
  sysbvm_type_setPrintStringFunction(context,sVar2,sVar1);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"i32",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"asInt32",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asInteger",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"negated",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_negated);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"bitInvert",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_bitInvert);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"highBit",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_highBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"lowBit",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_lowBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"+",2,0x1c,(void *)0x0,sysbvm_int32_primitive_add);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"-",2,0x1c,(void *)0x0,
             sysbvm_int32_primitive_subtract);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"*",2,0x1c,(void *)0x0,
             sysbvm_int32_primitive_multiply);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"/",2,0x1c,(void *)0x0,sysbvm_int32_primitive_divide
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"//",2,0x1c,(void *)0x0,
             sysbvm_int32_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"%",2,0x1c,(void *)0x0,
             sysbvm_int32_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"\\\\",2,0x1c,(void *)0x0,
             sysbvm_int32_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"&",2,0x1c,(void *)0x0,sysbvm_int32_primitive_bitAnd
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"|",2,0x1c,(void *)0x0,sysbvm_int32_primitive_bitOr)
  ;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"^",2,0x1c,(void *)0x0,sysbvm_int32_primitive_bitXor
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"<<",2,0x1c,(void *)0x0,
             sysbvm_int32_primitive_shiftLeft);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,">>",2,0x1c,(void *)0x0,
             sysbvm_int32_primitive_shiftRight);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"=",2,0x1c,(void *)0x0,sysbvm_int32_primitive_equals
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"~=",2,0x1c,(void *)0x0,
             sysbvm_int32_primitive_notEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"<",2,0x1c,(void *)0x0,
             sysbvm_int32_primitive_lessThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"<=",2,0x1c,(void *)0x0,
             sysbvm_int32_primitive_lessEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,">",2,0x1c,(void *)0x0,
             sysbvm_int32_primitive_greaterThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,">=",2,0x1c,(void *)0x0,
             sysbvm_int32_primitive_greaterEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asBoolean",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asBoolean);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asBoolean16",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asBoolean16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asBoolean32",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asBoolean32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asBoolean64",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asBoolean64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asUInt8",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asUInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asInt8",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asChar8",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asChar8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asUInt16",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asUInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asInt16",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asChar16",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asChar16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asUInt32",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asUInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asInt32",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asChar32",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asChar32);
  pcVar4 = sysbvm_int32_primitive_asUInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asUInt64",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asUInt64);
  pcVar3 = sysbvm_int32_primitive_asInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asInt64",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asInt64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asFloat32",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asFloat32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asFloat64",1,0x1c,(void *)0x0,
             sysbvm_int32_primitive_asFloat64);
  if ((context->roots).sizeType == (context->roots).uint32Type) {
    pcVar4 = sysbvm_int32_primitive_asUInt32;
    pcVar3 = sysbvm_int32_primitive_asInt32;
  }
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asUIntPointer",1,0x1c,(void *)0x0,pcVar4);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asIntPointer",1,0x1c,(void *)0x0,pcVar3);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int32Type,"asSize",1,0x1c,(void *)0x0,pcVar4);
  sVar2 = (context->roots).uint64Type;
  sVar1 = sysbvm_function_createPrimitive
                    (context,1,0x1c,(void *)0x0,sysbvm_uint64_primitive_printString);
  sysbvm_type_setPrintStringFunction(context,sVar2,sVar1);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"u64",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"asUInt64",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asInteger",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"negated",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_negated);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"bitInvert",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_bitInvert);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"highBit",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_highBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"lowBit",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_lowBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"+",2,0x1c,(void *)0x0,sysbvm_uint64_primitive_add)
  ;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"-",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_subtract);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"*",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_multiply);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"/",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"//",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"%",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"\\\\",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"&",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_bitAnd);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"|",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_bitOr);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"^",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_bitXor);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"<<",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_shiftLeft);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,">>",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_shiftRight);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"=",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_equals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"~=",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_notEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"<",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_lessThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"<=",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_lessEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,">",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_greaterThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,">=",2,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_greaterEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asBoolean",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asBoolean);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asBoolean16",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asBoolean16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asBoolean32",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asBoolean32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asBoolean64",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asBoolean64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asUInt8",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asUInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asInt8",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asChar8",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asChar8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asUInt16",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asUInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asInt16",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asChar16",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asChar16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asUInt32",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asUInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asInt32",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asChar32",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asChar32);
  pcVar4 = sysbvm_uint64_primitive_asUInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asUInt64",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asUInt64);
  pcVar3 = sysbvm_uint64_primitive_asInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asInt64",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asInt64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asFloat32",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asFloat32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asFloat64",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_asFloat64);
  if ((context->roots).sizeType == (context->roots).uint32Type) {
    pcVar4 = sysbvm_uint64_primitive_asUInt32;
    pcVar3 = sysbvm_uint64_primitive_asInt32;
  }
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asUIntPointer",1,0x1c,(void *)0x0,pcVar4);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asIntPointer",1,0x1c,(void *)0x0,pcVar3);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).uint64Type,"asSize",1,0x1c,(void *)0x0,pcVar4);
  sVar2 = (context->roots).int64Type;
  sVar1 = sysbvm_function_createPrimitive
                    (context,1,0x1c,(void *)0x0,sysbvm_int64_primitive_printString);
  sysbvm_type_setPrintStringFunction(context,sVar2,sVar1);
  pcVar3 = sysbvm_int64_primitive_fromInteger;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"i64",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"asInt64",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_fromInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asInteger",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asInteger);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"negated",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_negated);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"bitInvert",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_bitInvert);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"highBit",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_highBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"lowBit",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_lowBit);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"+",2,0x1c,(void *)0x0,sysbvm_int64_primitive_add);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"-",2,0x1c,(void *)0x0,
             sysbvm_int64_primitive_subtract);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"*",2,0x1c,(void *)0x0,
             sysbvm_int64_primitive_multiply);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"/",2,0x1c,(void *)0x0,sysbvm_int64_primitive_divide
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"//",2,0x1c,(void *)0x0,
             sysbvm_int64_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"%",2,0x1c,(void *)0x0,
             sysbvm_int64_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"\\\\",2,0x1c,(void *)0x0,
             sysbvm_int64_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"&",2,0x1c,(void *)0x0,sysbvm_int64_primitive_bitAnd
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"|",2,0x1c,(void *)0x0,sysbvm_int64_primitive_bitOr)
  ;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"^",2,0x1c,(void *)0x0,sysbvm_int64_primitive_bitXor
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"<<",2,0x1c,(void *)0x0,
             sysbvm_int64_primitive_shiftLeft);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,">>",2,0x1c,(void *)0x0,
             sysbvm_int64_primitive_shiftRight);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"=",2,0x1c,(void *)0x0,sysbvm_int64_primitive_equals
            );
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"~=",2,0x1c,(void *)0x0,
             sysbvm_int64_primitive_notEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"<",2,0x1c,(void *)0x0,
             sysbvm_int64_primitive_lessThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"<=",2,0x1c,(void *)0x0,
             sysbvm_int64_primitive_lessEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,">",2,0x1c,(void *)0x0,
             sysbvm_int64_primitive_greaterThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,">=",2,0x1c,(void *)0x0,
             sysbvm_int64_primitive_greaterEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asBoolean",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asBoolean);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asBoolean16",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asBoolean16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asBoolean32",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asBoolean32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asBoolean64",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asBoolean64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asUInt8",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asUInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asInt8",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asChar8",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asChar8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asUInt16",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asUInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asInt16",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asChar16",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asChar16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asUInt32",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asUInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asInt32",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asChar32",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asChar32);
  pcVar4 = sysbvm_int64_primitive_asUInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asUInt64",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asUInt64);
  entryPoint = sysbvm_int64_primitive_asInt64;
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asInt64",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asInt64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asFloat32",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asFloat32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asFloat64",1,0x1c,(void *)0x0,
             sysbvm_int64_primitive_asFloat64);
  if ((context->roots).sizeType == (context->roots).uint32Type) {
    pcVar4 = sysbvm_int64_primitive_asUInt32;
    entryPoint = sysbvm_int64_primitive_asInt32;
  }
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asUIntPointer",1,0x1c,(void *)0x0,pcVar4);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asIntPointer",1,0x1c,(void *)0x0,entryPoint);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).int64Type,"asSize",1,0x1c,(void *)0x0,pcVar4);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"bflgs",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_fromInteger);
  bVar5 = (context->roots).sizeType != (context->roots).uint32Type;
  pcVar4 = sysbvm_uint32_primitive_fromInteger;
  if (bVar5) {
    pcVar4 = sysbvm_uint64_primitive_fromInteger;
  }
  if (!bVar5) {
    pcVar3 = sysbvm_int32_primitive_fromInteger;
  }
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"uptr",1,0x1c,(void *)0x0,pcVar4);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"iptr",1,0x1c,(void *)0x0,pcVar3);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"sz",1,0x1c,(void *)0x0,pcVar4);
  sVar1 = sysbvm_symbol_internWithCString(context,"Size::+");
  sVar2 = (&(context->roots).uint32Type)[(ulong)bVar5 * 2];
  selector = sysbvm_symbol_internWithCString(context,"+");
  sVar2 = sysbvm_type_lookupSelector(context,sVar2,selector);
  sysbvm_context_setIntrinsicSymbolBindingValue(context,sVar1,sVar2);
  return;
}

Assistant:

void sysbvm_primitiveInteger_setupPrimitives(sysbvm_context_t *context)
{
    sysbvm_char8_setupPrimitives(context);
    sysbvm_uint8_setupPrimitives(context);
    sysbvm_int8_setupPrimitives(context);

    sysbvm_char16_setupPrimitives(context);
    sysbvm_uint16_setupPrimitives(context);
    sysbvm_int16_setupPrimitives(context);

    sysbvm_char32_setupPrimitives(context);
    sysbvm_uint32_setupPrimitives(context);
    sysbvm_int32_setupPrimitives(context);

    sysbvm_uint64_setupPrimitives(context);
    sysbvm_int64_setupPrimitives(context);

    if(sizeof(sysbvm_bitflags_t) == 4)
    {
        sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "bflgs", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_uint32_primitive_fromInteger);
    }
    else
    {
        sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "bflgs", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_uint64_primitive_fromInteger);
    }

    if(context->roots.sizeType == context->roots.uint32Type)
    {
        sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "uptr", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_uint32_primitive_fromInteger);
        sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "iptr", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_int32_primitive_fromInteger);
        sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "sz", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_uint32_primitive_fromInteger);
        sysbvm_context_setIntrinsicSymbolBindingValue(context, sysbvm_symbol_internWithCString(context, "Size::+"), sysbvm_type_lookupSelector(context, context->roots.uint32Type, sysbvm_symbol_internWithCString(context, "+")));
    }
    else
    {
        sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "uptr", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_uint64_primitive_fromInteger);
        sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "iptr", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_int64_primitive_fromInteger);
        sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "sz", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_uint64_primitive_fromInteger);
        sysbvm_context_setIntrinsicSymbolBindingValue(context, sysbvm_symbol_internWithCString(context, "Size::+"), sysbvm_type_lookupSelector(context, context->roots.uint64Type, sysbvm_symbol_internWithCString(context, "+")));
    }
}